

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::BlendA64Mask1DTestHBD_ExtremeValues_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::BlendA64Mask1DTestHBD_ExtremeValues_Test>
           *this)

{
  BlendA64Mask1DTestHBD *this_00;
  
  WithParamInterface<libaom_test::FuncParam<void(*)(unsigned_char*,unsigned_int,unsigned_char_const*,unsigned_int,unsigned_char_const*,unsigned_int,unsigned_char_const*,int,int,int)>>
  ::parameter_ = &this->parameter_;
  this_00 = (BlendA64Mask1DTestHBD *)operator_new(0xa0160);
  anon_unknown.dwarf_17898ce::BlendA64Mask1DTestHBD::BlendA64Mask1DTestHBD(this_00);
  (this_00->
  super_BlendA64Mask1DTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int),_unsigned_short>
  ).
  super_FunctionEquivalenceTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int)>
  .
  super_TestWithParam<libaom_test::FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int)>_>
  .super_Test._vptr_Test = (_func_int **)&PTR__TestWithParam_00f47168;
  (this_00->
  super_BlendA64Mask1DTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int),_unsigned_short>
  ).
  super_FunctionEquivalenceTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int)>
  .
  super_TestWithParam<libaom_test::FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int)>_>
  .
  super_WithParamInterface<libaom_test::FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int)>_>
  ._vptr_WithParamInterface = (_func_int **)&PTR__BlendA64Mask1DTestHBD_ExtremeValues_Test_00f471b0;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }